

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

int * __thiscall ED::sortAnchorsByGradValue1(ED *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__s;
  int *__s_00;
  int iVar3;
  int index;
  int grad_1;
  int j_1;
  int i_2;
  int *A;
  int local_30;
  int noAnchors;
  int i_1;
  int grad;
  int j;
  int i;
  int *C;
  int SIZE;
  ED *this_local;
  
  uVar2 = SUB168(ZEXT816(0x8000) * ZEXT816(4),0);
  if (SUB168(ZEXT816(0x8000) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar2);
  memset(__s,0,0x20000);
  for (grad = 1; grad < this->height + -1; grad = grad + 1) {
    for (i_1 = 1; i_1 < this->width + -1; i_1 = i_1 + 1) {
      if (this->edgeImg[grad * this->width + i_1] == 0xfe) {
        *(int *)((long)__s + (long)(int)this->gradImg[grad * this->width + i_1] * 4) =
             *(int *)((long)__s + (long)(int)this->gradImg[grad * this->width + i_1] * 4) + 1;
      }
    }
  }
  for (local_30 = 1; local_30 < 0x8000; local_30 = local_30 + 1) {
    *(int *)((long)__s + (long)local_30 * 4) =
         *(int *)((long)__s + (long)(local_30 + -1) * 4) + *(int *)((long)__s + (long)local_30 * 4);
  }
  iVar3 = *(int *)((long)__s + 0x1fffc);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar3;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar2);
  memset(__s_00,0,(long)iVar3 << 2);
  for (grad_1 = 1; grad_1 < this->height + -1; grad_1 = grad_1 + 1) {
    for (index = 1; index < this->width + -1; index = index + 1) {
      if (this->edgeImg[grad_1 * this->width + index] == 0xfe) {
        iVar3 = *(int *)((long)__s + (long)(int)this->gradImg[grad_1 * this->width + index] * 4) +
                -1;
        *(int *)((long)__s + (long)(int)this->gradImg[grad_1 * this->width + index] * 4) = iVar3;
        __s_00[iVar3] = grad_1 * this->width + index;
      }
    }
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  return __s_00;
}

Assistant:

int * ED::sortAnchorsByGradValue1()
{
	int SIZE = 128 * 256;
	int *C = new int[SIZE];
	memset(C, 0, sizeof(int)*SIZE);

	// Count the number of grad values
	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			C[grad]++;
		} //end-for
	} //end-for 

	// Compute indices
	for (int i = 1; i<SIZE; i++) C[i] += C[i - 1];

	int noAnchors = C[SIZE - 1];
	int *A = new int[noAnchors];
	memset(A, 0, sizeof(int)*noAnchors);


	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			int index = --C[grad];
			A[index] = i*width + j;    // anchor's offset 
		} //end-for
	} //end-for  

	delete[] C;

	/*
	ofstream myFile;
	myFile.open("aNew.txt");
	for (int i = 0; i < noAnchors; i++)
		myFile << A[i] << endl;

	myFile.close(); */

	return A;

}